

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O2

float __thiscall nv::Filter::sampleBox(Filter *this,float x,float scale,int samples)

{
  int iVar1;
  int iVar2;
  float extraout_XMM0_Da;
  float fVar3;
  
  iVar2 = 0;
  iVar1 = samples;
  if (samples < 1) {
    iVar1 = 0;
  }
  fVar3 = 0.0;
  for (; iVar1 != iVar2; iVar2 = iVar2 + 1) {
    (*this->_vptr_Filter[2])((((float)iVar2 + 0.5) * (1.0 / (float)samples) + x) * scale,this);
    fVar3 = fVar3 + extraout_XMM0_Da;
  }
  return (1.0 / (float)samples) * fVar3;
}

Assistant:

float Filter::sampleBox(float x, float scale, int samples) const
{
	float sum = 0;
	float isamples = 1.0f / float(samples);

	for(int s = 0; s < samples; s++)
	{
		float p = (x + (float(s) + 0.5f) * isamples) * scale;
		float value = evaluate(p);
		sum += value;
	}
	
	return sum * isamples;
}